

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::compute_split_pca
          (clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *left_child_res,
          vec<16U,_float> *right_child_res,vq_node *parent_node)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar4;
  row_vec *prVar5;
  float *pfVar6;
  long in_RCX;
  vec<16U,_float> *in_RDX;
  vec<16U,_float> *in_RSI;
  vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_> *in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  double t;
  vec<16U,_float> *v_1;
  float weight;
  uint i_3;
  double right_weight;
  double left_weight;
  vec<16U,_float> right_child;
  vec<16U,_float> left_child;
  vec<16U,_float> delta_axis;
  uint j;
  double sum;
  uint i_2;
  double max_sum;
  vec<16U,_float> x_3;
  uint iter;
  vec<16U,_float> prev_axis;
  uint i_1;
  vec<16U,_float> axis;
  uint y_2;
  uint x_2;
  uint y_1;
  uint x_1;
  float one_over_total_weight;
  uint y;
  uint x;
  vec<16U,_float> w;
  vec<16U,_float> v;
  uint i;
  matrix<16U,_16U,_float> covar;
  uint N;
  float in_stack_fffffffffffff7ec;
  uint uVar10;
  float in_stack_fffffffffffff7f0;
  float in_stack_fffffffffffff7f4;
  float in_stack_fffffffffffff7f8;
  float in_stack_fffffffffffff7fc;
  float in_stack_fffffffffffff800;
  float in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  vec<16U,_float> local_7d8;
  vec<16U,_float> local_798;
  vec<16U,_float> local_758;
  vec<16U,_float> local_718;
  vec<16U,_float> local_6d8;
  double local_698;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *local_690;
  float local_688;
  uint local_684;
  double local_680;
  double local_678;
  vq_node *in_stack_fffffffffffff9b8;
  vec<16U,_float> *in_stack_fffffffffffff9c0;
  vec<16U,_float> *in_stack_fffffffffffff9c8;
  clusterizer<crnlib::vec<16U,_float>_> *in_stack_fffffffffffff9d0;
  vec<16U,_float> local_5ec;
  uint local_5ac;
  double local_5a8;
  uint local_59c;
  double local_598;
  vec<16U,_float> local_58c;
  uint local_54c;
  vec<16U,_float> local_548;
  uint local_508;
  vec<16U,_float> local_504;
  uint local_4c4;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  float local_4b4;
  uint local_4b0;
  uint local_4ac;
  vec<16U,_float> local_4a8;
  vec<16U,_float> local_468;
  uint local_428;
  matrix<16U,_16U,_float> local_424;
  undefined4 local_24;
  long local_20;
  vec<16U,_float> *local_18;
  vec<16U,_float> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RCX + 0x50));
  if (uVar1 == 2) {
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x50),0);
    ppVar4 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
    vec<16U,_float>::operator=(local_10,&ppVar4->first);
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x50),1);
    ppVar4 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
    vec<16U,_float>::operator=(local_18,&ppVar4->first);
  }
  else {
    local_24 = 0x10;
    matrix<16U,_16U,_float>::matrix
              ((matrix<16U,_16U,_float> *)
               CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
    matrix<16U,_16U,_float>::clear
              ((matrix<16U,_16U,_float> *)
               CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    for (local_428 = 0; uVar10 = local_428,
        uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)(local_20 + 0x50)),
        uVar10 < uVar1; local_428 = local_428 + 1) {
      puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x50),local_428)
      ;
      vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
      crnlib::operator-((vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                        (vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
      puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x50),local_428)
      ;
      vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
      crnlib::operator*((vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                        in_stack_fffffffffffff7f4);
      for (local_4ac = 0; local_4ac < 0x10; local_4ac = local_4ac + 1) {
        for (local_4b0 = local_4ac; local_4b0 < 0x10; local_4b0 = local_4b0 + 1) {
          prVar5 = matrix<16U,_16U,_float>::operator[](&local_424,local_4ac);
          pfVar6 = vec<16U,_float>::operator[](prVar5,local_4b0);
          fVar9 = *pfVar6;
          fVar7 = vec<16U,_float>::operator[](&local_468,local_4ac);
          fVar8 = vec<16U,_float>::operator[](&local_4a8,local_4b0);
          prVar5 = matrix<16U,_16U,_float>::operator[](&local_424,local_4ac);
          pfVar6 = vec<16U,_float>::operator[](prVar5,local_4b0);
          *pfVar6 = fVar9 + fVar7 * fVar8;
        }
      }
    }
    fVar9 = (float)(long)*(ulong *)(local_20 + 0x40);
    fVar7 = (float)*(ulong *)(local_20 + 0x40);
    local_4b4 = 1.0 / fVar7;
    for (local_4b8 = 0; local_4b8 < 0x10; local_4b8 = local_4b8 + 1) {
      for (local_4bc = local_4b8; local_4bc < 0x10; local_4bc = local_4bc + 1) {
        in_stack_fffffffffffff804 = local_4b4;
        prVar5 = matrix<16U,_16U,_float>::operator[](&local_424,local_4b8);
        pfVar6 = vec<16U,_float>::operator[](prVar5,local_4bc);
        *pfVar6 = in_stack_fffffffffffff804 * *pfVar6;
      }
    }
    for (local_4c0 = 0; uVar1 = local_4c0, local_4c0 < 0xf; local_4c0 = local_4c0 + 1) {
      while (local_4c4 = uVar1 + 1, local_4c4 < 0x10) {
        prVar5 = matrix<16U,_16U,_float>::operator[](&local_424,local_4c0);
        pfVar6 = vec<16U,_float>::operator[](prVar5,local_4c4);
        in_stack_fffffffffffff800 = *pfVar6;
        prVar5 = matrix<16U,_16U,_float>::operator[](&local_424,local_4c4);
        pfVar6 = vec<16U,_float>::operator[](prVar5,local_4c0);
        *pfVar6 = in_stack_fffffffffffff800;
        uVar1 = local_4c4;
      }
    }
    vec<16U,_float>::vec(&local_504);
    for (local_508 = 0; local_508 < 0x10; local_508 = local_508 + 1) {
      in_stack_fffffffffffff7f8 = (float)local_508;
      iVar2 = math::maximum<int>(0xf,1);
      in_stack_fffffffffffff7fc =
           math::lerp<float,float>(0.75,1.25,in_stack_fffffffffffff7f8 * (1.0 / (float)iVar2));
      pfVar6 = vec<16U,_float>::operator[](&local_504,local_508);
      *pfVar6 = in_stack_fffffffffffff7fc;
    }
    vec<16U,_float>::vec(&local_548,&local_504);
    for (local_54c = 0; local_54c < 10; local_54c = local_54c + 1) {
      vec<16U,_float>::vec(&local_58c);
      local_598 = 0.0;
      for (local_59c = 0; local_59c < 0x10; local_59c = local_59c + 1) {
        local_5a8 = 0.0;
        for (local_5ac = 0; local_5ac < 0x10; local_5ac = local_5ac + 1) {
          pfVar6 = vec<16U,_float>::operator[](&local_504,local_5ac);
          in_stack_fffffffffffff7f4 = *pfVar6;
          prVar5 = matrix<16U,_16U,_float>::operator[](&local_424,local_59c);
          pfVar6 = vec<16U,_float>::operator[](prVar5,local_5ac);
          local_5a8 = (double)(in_stack_fffffffffffff7f4 * *pfVar6) + local_5a8;
        }
        in_stack_fffffffffffff7f0 = (float)local_5a8;
        pfVar6 = vec<16U,_float>::operator[](&local_58c,local_59c);
        *pfVar6 = in_stack_fffffffffffff7f0;
        local_598 = math::maximum<double>
                              (local_598,(double)((ulong)local_5a8 & (ulong)DAT_00248210));
      }
      if ((local_598 != 0.0) || (NAN(local_598))) {
        vec<16U,_float>::operator*=(&local_58c,(float)(1.0 / local_598));
      }
      crnlib::operator-((vec<16U,_float> *)CONCAT44(fVar7,fVar9),
                        (vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
      vec<16U,_float>::operator=(&local_548,&local_504);
      vec<16U,_float>::operator=(&local_504,&local_58c);
      fVar8 = vec<16U,_float>::norm(&local_5ec);
      if (fVar8 < 0.0025) break;
    }
    vec<16U,_float>::normalize
              ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
               (vec<16U,_float> *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
    vec<16U,_float>::vec
              ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
               in_stack_fffffffffffff7ec);
    vec<16U,_float>::vec
              ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
               in_stack_fffffffffffff7ec);
    local_678 = 0.0;
    local_680 = 0.0;
    local_684 = 0;
    while (uVar10 = local_684,
          uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)(local_20 + 0x50)),
          uVar10 < uVar1) {
      puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x50),local_684)
      ;
      ppVar4 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3)
      ;
      local_688 = (float)ppVar4->second;
      puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x50),local_684)
      ;
      local_690 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[]
                            (in_RDI,*puVar3);
      crnlib::operator-((vec<16U,_float> *)CONCAT44(fVar7,fVar9),
                        (vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
      fVar8 = crnlib::operator*(&local_6d8,&local_504);
      local_698 = (double)fVar8;
      if (0.0 <= local_698) {
        crnlib::operator*((vec<16U,_float> *)
                          CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                          in_stack_fffffffffffff7f4);
        vec<16U,_float>::operator+=((vec<16U,_float> *)&stack0xfffffffffffff994,&local_758);
        local_680 = (double)local_688 + local_680;
      }
      else {
        crnlib::operator*((vec<16U,_float> *)
                          CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                          in_stack_fffffffffffff7f4);
        vec<16U,_float>::operator+=((vec<16U,_float> *)&stack0xfffffffffffff9d4,&local_718);
        local_678 = (double)local_688 + local_678;
      }
      local_684 = local_684 + 1;
    }
    if ((local_678 <= 0.0) || (local_680 <= 0.0)) {
      compute_split_estimate
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                 in_stack_fffffffffffff9b8);
    }
    else {
      crnlib::operator*((vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                        in_stack_fffffffffffff7f4);
      vec<16U,_float>::operator=(local_10,&local_798);
      crnlib::operator*((vec<16U,_float> *)
                        CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                        in_stack_fffffffffffff7f4);
      vec<16U,_float>::operator=(local_18,&local_7d8);
    }
  }
  return;
}

Assistant:

void compute_split_pca(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    if (parent_node.m_vectors.size() == 2) {
      left_child_res = m_training_vecs[parent_node.m_vectors[0]].first;
      right_child_res = m_training_vecs[parent_node.m_vectors[1]].first;
      return;
    }

    const uint N = VectorType::num_elements;

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType v(m_training_vecs[parent_node.m_vectors[i]].first - parent_node.m_centroid);
      const VectorType w(v * (float)m_training_vecs[parent_node.m_vectors[i]].second);

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    float one_over_total_weight = 1.0f / parent_node.m_total_weight;

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] *= one_over_total_weight;

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;  //(1.0f);
    if (N == 1)
      axis.set(1.0f);
    else {
      for (uint i = 0; i < N; i++)
        axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / math::maximum<int>(N - 1, 1)));
    }

    VectorType prev_axis(axis);

    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    VectorType left_child(0.0f);
    VectorType right_child(0.0f);

    double left_weight = 0.0f;
    double right_weight = 0.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const float weight = (float)m_training_vecs[parent_node.m_vectors[i]].second;

      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double t = (v - parent_node.m_centroid) * axis;
      if (t < 0.0f) {
        left_child += v * weight;
        left_weight += weight;
      } else {
        right_child += v * weight;
        right_weight += weight;
      }
    }

    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child_res = left_child * (float)(1.0f / left_weight);
      right_child_res = right_child * (float)(1.0f / right_weight);
    } else {
      compute_split_estimate(left_child_res, right_child_res, parent_node);
    }
  }